

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_update_tlm(opj_j2k_t *p_j2k,OPJ_UINT32 p_tile_part_size)

{
  OPJ_UINT32 p_tile_part_size_local;
  opj_j2k_t *p_j2k_local;
  
  if ((p_j2k->m_specific_param).m_encoder.m_Ttlmi_is_byte == 0) {
    opj_write_bytes_LE((p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current,
                       p_j2k->m_current_tile_number,2);
    (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current =
         (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current + 2;
  }
  else {
    opj_write_bytes_LE((p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current,
                       p_j2k->m_current_tile_number,1);
    (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current =
         (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current + 1;
  }
  opj_write_bytes_LE((p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current,p_tile_part_size,
                     4);
  (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current =
       (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current + 4;
  return;
}

Assistant:

static void opj_j2k_update_tlm(opj_j2k_t * p_j2k, OPJ_UINT32 p_tile_part_size)
{
    if (p_j2k->m_specific_param.m_encoder.m_Ttlmi_is_byte) {
        opj_write_bytes(p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current,
                        p_j2k->m_current_tile_number, 1);
        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current += 1;
    } else {
        opj_write_bytes(p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current,
                        p_j2k->m_current_tile_number, 2);
        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current += 2;
    }

    opj_write_bytes(p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current,
                    p_tile_part_size, 4);                                       /* PSOT */
    p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current += 4;
}